

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O1

void Aig_ObjCreateRepr(Aig_Man_t *p,Aig_Obj_t *pNode1,Aig_Obj_t *pNode2)

{
  int iVar1;
  
  if (p->pReprs == (Aig_Obj_t **)0x0) {
    __assert_fail("p->pReprs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aigRepr.c"
                  ,0x55,"void Aig_ObjCreateRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if (((ulong)pNode1 & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pNode1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aigRepr.c"
                  ,0x56,"void Aig_ObjCreateRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if (((ulong)pNode2 & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pNode2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aigRepr.c"
                  ,0x57,"void Aig_ObjCreateRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if (pNode1->Id < p->nReprsAlloc) {
    iVar1 = pNode2->Id;
    if (p->nReprsAlloc <= iVar1) {
      __assert_fail("pNode2->Id < p->nReprsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aigRepr.c"
                    ,0x59,"void Aig_ObjCreateRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
    }
    if (pNode1->Id < iVar1) {
      p->pReprs[iVar1] = pNode1;
      return;
    }
    __assert_fail("pNode1->Id < pNode2->Id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aigRepr.c"
                  ,0x5a,"void Aig_ObjCreateRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  __assert_fail("pNode1->Id < p->nReprsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aigRepr.c"
                ,0x58,"void Aig_ObjCreateRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
}

Assistant:

void Aig_ObjCreateRepr( Aig_Man_t * p, Aig_Obj_t * pNode1, Aig_Obj_t * pNode2 )
{
    assert( p->pReprs != NULL );
    assert( !Aig_IsComplement(pNode1) );
    assert( !Aig_IsComplement(pNode2) );
    assert( pNode1->Id < p->nReprsAlloc );
    assert( pNode2->Id < p->nReprsAlloc );
    assert( pNode1->Id < pNode2->Id );
    p->pReprs[pNode2->Id] = pNode1;
}